

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void __thiscall kj::UnixEventPort::~UnixEventPort(UnixEventPort *this)

{
  (this->super_EventPort)._vptr_EventPort = (_func_int **)&PTR_wait_00597da0;
  (this->super_SleepHooks)._vptr_SleepHooks = (_func_int **)&DAT_00597de0;
  if ((this->childSet).ptr.ptr != (ChildSet *)0x0) {
    (anonymous_namespace)::threadClaimedChildExits._0_1_ = 0;
  }
  Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>::dispose(&(this->childSet).ptr);
  kj::_::NullableValue<kj::OwnFd>::~NullableValue(&(this->timerFd).ptr);
  OwnFd::~OwnFd(&this->eventFd);
  OwnFd::~OwnFd(&this->epollFd);
  TimerImpl::~TimerImpl(&this->timerImpl);
  return;
}

Assistant:

UnixEventPort::~UnixEventPort() noexcept(false) {
  if (childSet != kj::none) {
    // We had claimed the exclusive right to call onChildExit(). Release that right.
    threadClaimedChildExits = false;
  }
}